

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O2

bool __thiscall ON_NurbsCage::IsClosed(ON_NurbsCage *this,int dir)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int j;
  double *pointA;
  double *pointB;
  int i;
  int j_00;
  int k;
  int i_00;
  int d [3];
  
  if (((uint)dir < 3) && (0 < this->m_dim)) {
    bVar4 = ON_IsKnotVectorClamped
                      (this->m_order[(uint)dir],this->m_cv_count[(uint)dir],this->m_knot[(uint)dir],
                       2);
    if (!bVar4) {
      bVar4 = IsPeriodic(this,dir);
      return bVar4;
    }
    d[2] = 0;
    d[0] = 0;
    d[1] = 0;
    d[(uint)dir] = this->m_cv_count[(uint)dir] + -1;
    iVar3 = d[2];
    iVar1 = (int)d._0_8_;
    iVar2 = SUB84(d._0_8_,4);
    for (i_00 = 0; i = iVar1 + i_00, i < this->m_cv_count[0]; i_00 = i_00 + 1) {
      for (j_00 = 0; j = iVar2 + j_00, j < this->m_cv_count[1]; j_00 = j_00 + 1) {
        k = 0;
        while (iVar3 + k < this->m_cv_count[2]) {
          pointA = CV(this,i_00,j_00,k);
          pointB = CV(this,i,j,iVar3 + k);
          bVar4 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat,pointA,pointB);
          k = k + 1;
          if (!bVar4) goto LAB_0055febd;
        }
      }
    }
    bVar4 = true;
  }
  else {
LAB_0055febd:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ON_NurbsCage::IsClosed(int dir) const
{
  bool bIsClosed = false;
  if ( dir >= 0 && dir <= 2 && m_dim > 0)
  {
    if ( ON_IsKnotVectorClamped( m_order[dir], m_cv_count[dir], m_knot[dir] ) ) 
    {
      const double *cv0, *cv1;
      int i,j,k,d[3] = {0,0,0};
      d[dir] = m_cv_count[dir] - 1;
      for ( i = 0; i+d[0] < m_cv_count[0]; i++ )
      {
        for ( j = 0; j+d[1] < m_cv_count[1]; j++ )
        {
          for ( k = 0; k+d[2] < m_cv_count[2]; k++ )
          {
            cv0 = CV(i,j,k);
            cv1 = CV(i+d[0],j+d[1],k+d[2]);
            if ( false == ON_PointsAreCoincident( m_dim, m_is_rat, cv0, cv1 ) )
              return false;
          }
        }
      }
      bIsClosed = true;
    }
    else
    {
      bIsClosed =  IsPeriodic(dir);
    }
  }
  return bIsClosed;
}